

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayGet(InternalAnalyzer *this,ArrayGet *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  pEVar1 = this->parent;
  if (bVar2) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->readsArray = true;
    pEVar1->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      // traps when the arg is null or the index out of bounds
      parent.implicitTrap = true;
    }